

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_stats_scan_sse41_128_16.c
# Opt level: O0

parasail_result_t *
parasail_nw_stats_scan_profile_sse41_128_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  int iVar1;
  int iVar2;
  int iVar3;
  parasail_matrix_t *ppVar4;
  void *pvVar5;
  void *pvVar6;
  void *pvVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  longlong lVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  longlong lVar13;
  ulong uVar14;
  ulong uVar15;
  longlong lVar16;
  longlong lVar17;
  longlong lVar18;
  longlong lVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  ushort uVar71;
  short sVar72;
  short sVar73;
  int iVar74;
  int iVar75;
  __m128i *b;
  __m128i *b_00;
  __m128i *b_01;
  __m128i *b_02;
  __m128i *ptr;
  __m128i *b_03;
  __m128i *b_04;
  __m128i *b_05;
  __m128i *ptr_00;
  __m128i *ptr_01;
  __m128i *ptr_02;
  __m128i *ptr_03;
  __m128i *ptr_04;
  __m128i *ptr_05;
  int16_t *ptr_06;
  uint uVar76;
  int iVar77;
  longlong extraout_RDX;
  longlong extraout_RDX_00;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  longlong extraout_RDX_03;
  longlong extraout_RDX_04;
  longlong extraout_RDX_05;
  ushort uVar78;
  long lVar79;
  long lVar80;
  long lVar81;
  long lVar82;
  long lVar83;
  long lVar84;
  ushort uVar91;
  short sVar92;
  ushort uVar93;
  short sVar94;
  short sVar96;
  ushort uVar97;
  ushort uVar98;
  short sVar99;
  ushort uVar102;
  ushort uVar103;
  short sVar104;
  ushort uVar105;
  ushort uVar106;
  short sVar107;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  ushort uVar95;
  ushort uVar108;
  ulong uVar100;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  ulong uVar101;
  ushort uVar109;
  short sVar110;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  __m128i alVar113;
  __m128i alVar114;
  __m128i alVar115;
  __m128i alVar116;
  __m128i c;
  __m128i c_00;
  __m128i c_01;
  ulong uStack_1498;
  __m128i vHL_1;
  __m128i vHS_1;
  __m128i vHM_1;
  __m128i vH_1;
  __m128i vFtL;
  __m128i vFtS;
  __m128i vFtM;
  __m128i vFt;
  __m128i vGapperL_1;
  __m128i vGapper_1;
  __m128i case2;
  __m128i case1;
  __m128i vWS;
  __m128i *pvWS;
  __m128i vWM;
  __m128i *pvWM;
  __m128i vW;
  __m128i *pvW;
  __m128i vHpL;
  __m128i vHpS;
  __m128i vHpM;
  __m128i vHp;
  __m128i vHL;
  __m128i vHS;
  __m128i vHM;
  __m128i vH;
  __m128i vFL;
  __m128i vFS;
  __m128i vFM;
  __m128i vF_opn;
  __m128i vF_ext;
  __m128i vF;
  __m128i vHtL;
  __m128i vHtS;
  __m128i vHtM;
  __m128i vHt;
  __m128i vEL;
  __m128i vES;
  __m128i vEM;
  __m128i vE_opn;
  __m128i vE_ext;
  __m128i vE;
  int64_t tmp_1;
  int64_t tmp;
  __m128i_16_t h;
  int local_11d0;
  int local_11cc;
  int32_t segNum;
  int32_t index;
  __m128i vGapperL;
  __m128i vGapper;
  parasail_result_t *result;
  __m128i vSegLen;
  __m128i vSegLenXgap;
  __m128i vNegInfFront;
  __m128i vSaturationCheckMax;
  __m128i vSaturationCheckMin;
  __m128i vPosLimit;
  __m128i vNegLimit;
  short local_1120;
  short local_111e;
  short local_111c;
  short local_111a;
  int16_t length;
  int16_t similar;
  int16_t matches;
  int16_t score;
  __m128i vOne;
  __m128i vZero;
  int16_t POS_LIMIT;
  int16_t NEG_LIMIT;
  __m128i vGapE;
  __m128i vGapO;
  int16_t *boundary;
  __m128i *pvGapperL;
  __m128i *pvGapper;
  __m128i *pvHLMax;
  __m128i *pvHSMax;
  __m128i *pvHMMax;
  __m128i *pvHMax;
  __m128i *pvHL;
  __m128i *pvHS;
  __m128i *pvHM;
  __m128i *pvH;
  __m128i *pvEL;
  __m128i *pvES;
  __m128i *pvEM;
  __m128i *pvE;
  __m128i *pvPs;
  __m128i *pvPm;
  __m128i *pvP;
  int32_t position;
  int32_t offset;
  int32_t segLen;
  int32_t segWidth;
  parasail_matrix_t *matrix;
  int local_1010;
  int32_t end_ref;
  int32_t end_query;
  int32_t s1Len;
  int32_t k;
  int32_t j;
  int32_t i;
  int gap_local;
  int open_local;
  int s2Len_local;
  char *s2_local;
  parasail_profile_t *profile_local;
  short local_a18;
  short sStack_a16;
  short sStack_a14;
  short sStack_a12;
  short sStack_a10;
  short sStack_a0e;
  short sStack_a0c;
  short sStack_a0a;
  short sStack_9e6;
  short sStack_9e4;
  short sStack_9e2;
  short sStack_9e0;
  short sStack_9de;
  short sStack_9dc;
  short sStack_9da;
  short local_9d8;
  short sStack_9d6;
  short sStack_9d4;
  short sStack_9d2;
  short sStack_9d0;
  short sStack_9ce;
  short sStack_9cc;
  short sStack_9ca;
  short local_9c8;
  short sStack_9c6;
  short sStack_9c4;
  short sStack_9c2;
  short sStack_9c0;
  short sStack_9be;
  short sStack_9bc;
  short sStack_9ba;
  short local_9b8;
  short sStack_9b6;
  short sStack_9b4;
  short sStack_9b2;
  short sStack_9b0;
  short sStack_9ae;
  short sStack_9ac;
  short sStack_9aa;
  short local_998;
  short sStack_996;
  short sStack_994;
  short sStack_992;
  short sStack_990;
  short sStack_98e;
  short sStack_98c;
  short sStack_98a;
  short local_988;
  short sStack_986;
  short sStack_984;
  short sStack_982;
  short sStack_980;
  short sStack_97e;
  short sStack_97c;
  short sStack_97a;
  short local_968;
  short sStack_966;
  short sStack_964;
  short sStack_962;
  short sStack_960;
  short sStack_95e;
  short sStack_95c;
  short sStack_95a;
  short sStack_952;
  short sStack_94e;
  short sStack_94c;
  short sStack_94a;
  short local_948;
  short sStack_946;
  short sStack_944;
  short sStack_942;
  short sStack_940;
  short sStack_93e;
  short sStack_93c;
  short sStack_93a;
  short local_938;
  short sStack_936;
  short sStack_934;
  short sStack_932;
  short sStack_930;
  short sStack_92e;
  short sStack_92c;
  short sStack_92a;
  short local_928;
  short sStack_926;
  short sStack_924;
  short sStack_922;
  short sStack_920;
  short sStack_91e;
  short sStack_91c;
  short sStack_91a;
  short local_908;
  short sStack_906;
  short sStack_904;
  short sStack_902;
  short sStack_900;
  short sStack_8fe;
  short sStack_8fc;
  short sStack_8fa;
  short local_8e8;
  short sStack_8e6;
  short sStack_8e4;
  short sStack_8e2;
  short sStack_8e0;
  short sStack_8de;
  short sStack_8dc;
  short sStack_8da;
  short local_8b8;
  short sStack_8b6;
  short sStack_8b4;
  short sStack_8b2;
  short sStack_8b0;
  short sStack_8ae;
  short sStack_8ac;
  short sStack_8aa;
  short local_888;
  short sStack_886;
  short sStack_884;
  short sStack_882;
  short sStack_880;
  short sStack_87e;
  short sStack_87c;
  short sStack_87a;
  ushort local_878;
  ushort uStack_876;
  ushort uStack_874;
  ushort uStack_872;
  ushort uStack_870;
  ushort uStack_86e;
  ushort uStack_86c;
  ushort uStack_86a;
  short local_868;
  short sStack_866;
  short sStack_864;
  short sStack_862;
  short sStack_860;
  short sStack_85e;
  short sStack_85c;
  short sStack_85a;
  short local_858;
  short sStack_856;
  short sStack_854;
  short sStack_852;
  short sStack_850;
  short sStack_84e;
  short sStack_84c;
  short sStack_84a;
  short local_7b8;
  short sStack_7b6;
  short sStack_7b4;
  short sStack_7b0;
  short local_148;
  short sStack_146;
  short sStack_144;
  short sStack_142;
  short sStack_140;
  short sStack_13e;
  short sStack_13c;
  short sStack_13a;
  short local_108;
  short sStack_106;
  short sStack_104;
  short sStack_102;
  short sStack_100;
  short sStack_fe;
  short sStack_fc;
  short sStack_fa;
  size_t len;
  
  if (profile == (parasail_profile_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_stats_scan_profile_sse41_128_16","profile");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if ((profile->profile16).score == (void *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_stats_scan_profile_sse41_128_16",
            "profile->profile16.score");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (profile->matrix == (parasail_matrix_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_stats_scan_profile_sse41_128_16",
            "profile->matrix");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (profile->s1Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_nw_stats_scan_profile_sse41_128_16",
            "profile->s1Len");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (s2 == (char *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_stats_scan_profile_sse41_128_16","s2");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (s2Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_nw_stats_scan_profile_sse41_128_16","s2Len");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (open < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_nw_stats_scan_profile_sse41_128_16","open");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (gap < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_nw_stats_scan_profile_sse41_128_16","gap");
    profile_local = (parasail_profile_t *)0x0;
  }
  else {
    iVar1 = profile->s1Len;
    local_1010 = iVar1 + -1;
    matrix._4_4_ = s2Len + -1;
    ppVar4 = profile->matrix;
    iVar74 = (iVar1 + 7) / 8;
    iVar77 = (iVar1 + -1) % iVar74;
    pvVar5 = (profile->profile16).score;
    pvVar6 = (profile->profile16).matches;
    pvVar7 = (profile->profile16).similar;
    i._0_2_ = (short)open;
    uVar8 = CONCAT26((short)i,CONCAT24((short)i,CONCAT22((short)i,(short)i)));
    uVar11 = CONCAT26((short)i,CONCAT24((short)i,CONCAT22((short)i,(short)i)));
    j._0_2_ = (short)gap;
    uVar9 = CONCAT26((short)j,CONCAT24((short)j,CONCAT22((short)j,(short)j)));
    uVar12 = CONCAT26((short)j,CONCAT24((short)j,CONCAT22((short)j,(short)j)));
    if (ppVar4->min <= -open) {
      i._0_2_ = -(short)ppVar4->min;
    }
    uVar71 = (short)i + 0x8001;
    sVar72 = ((ushort)ppVar4->max ^ 0x7fff) - 1;
    lVar10 = CONCAT26(uVar71,CONCAT24(uVar71,CONCAT22(uVar71,uVar71)));
    lVar13 = CONCAT26(uVar71,CONCAT24(uVar71,CONCAT22(uVar71,uVar71)));
    vSaturationCheckMax[1] = CONCAT26(sVar72,CONCAT24(sVar72,CONCAT22(sVar72,sVar72)));
    vSaturationCheckMin[0] = CONCAT26(sVar72,CONCAT24(sVar72,CONCAT22(sVar72,sVar72)));
    position._0_2_ = (short)iVar74;
    auVar70._2_2_ = (short)position;
    auVar70._0_2_ = (short)position;
    auVar70._4_2_ = (short)position;
    auVar70._10_2_ = (short)position;
    auVar70._8_2_ = (short)position;
    auVar70._12_2_ = (short)position;
    auVar70._6_2_ = (short)position;
    sVar73 = -(short)position * (short)j;
    auVar86._2_2_ = sVar73;
    auVar86._0_2_ = sVar73;
    auVar86._4_2_ = sVar73;
    auVar86._10_2_ = sVar73;
    auVar86._8_2_ = sVar73;
    auVar86._12_2_ = sVar73;
    auVar86._6_2_ = sVar73;
    auVar85._8_8_ = 0;
    auVar85._0_8_ = CONCAT62(0,uVar71);
    auVar86._14_2_ = 0;
    auVar85 = paddsw(auVar85,auVar86 << 0x10);
    profile_local = (parasail_profile_t *)parasail_result_new_stats();
    if (profile_local == (parasail_profile_t *)0x0) {
      profile_local = (parasail_profile_t *)0x0;
    }
    else {
      uVar76 = *(uint *)&profile_local->field_0xc | 0x8210401;
      len = (size_t)uVar76;
      *(uint *)&profile_local->field_0xc = uVar76;
      b = parasail_memalign___m128i(0x10,(long)iVar74);
      b_00 = parasail_memalign___m128i(0x10,(long)iVar74);
      b_01 = parasail_memalign___m128i(0x10,(long)iVar74);
      b_02 = parasail_memalign___m128i(0x10,(long)iVar74);
      ptr = parasail_memalign___m128i(0x10,(long)iVar74);
      b_03 = parasail_memalign___m128i(0x10,(long)iVar74);
      b_04 = parasail_memalign___m128i(0x10,(long)iVar74);
      b_05 = parasail_memalign___m128i(0x10,(long)iVar74);
      ptr_00 = parasail_memalign___m128i(0x10,(long)iVar74);
      ptr_01 = parasail_memalign___m128i(0x10,(long)iVar74);
      ptr_02 = parasail_memalign___m128i(0x10,(long)iVar74);
      ptr_03 = parasail_memalign___m128i(0x10,(long)iVar74);
      ptr_04 = parasail_memalign___m128i(0x10,(long)iVar74);
      ptr_05 = parasail_memalign___m128i(0x10,(long)iVar74);
      ptr_06 = parasail_memalign_int16_t(0x10,(long)(s2Len + 1));
      if (b == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (b_00 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (b_01 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (b_02 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (b_03 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (b_04 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (b_05 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_00 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_01 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_02 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_03 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_04 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_05 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_06 == (int16_t *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else {
        alVar113[0] = (long)iVar74;
        alVar113[1] = extraout_RDX;
        parasail_memset___m128i(b_03,alVar113,len);
        alVar114[0] = (long)iVar74;
        alVar114[1] = extraout_RDX_00;
        parasail_memset___m128i(b_04,alVar114,len);
        alVar115[0] = (long)iVar74;
        alVar115[1] = extraout_RDX_01;
        parasail_memset___m128i(b_05,alVar115,len);
        alVar116[0] = (long)iVar74;
        alVar116[1] = extraout_RDX_02;
        parasail_memset___m128i(b,alVar116,len);
        c[0] = (long)iVar74;
        c[1] = extraout_RDX_03;
        parasail_memset___m128i(b_00,c,len);
        c_00[0] = (long)iVar74;
        c_00[1] = extraout_RDX_04;
        parasail_memset___m128i(b_01,c_00,len);
        c_01[0] = (long)iVar74;
        c_01[1] = extraout_RDX_05;
        parasail_memset___m128i(b_02,c_01,len);
        auVar87._8_8_ = uVar11;
        auVar87._0_8_ = uVar8;
        register0x00001200 = psubsw(ZEXT816(0),auVar87);
        vGapperL[0] = 0x1000100010001;
        _segNum = 0x1000100010001;
        k = iVar74;
        while (k = k + -1, -1 < k) {
          ptr_04[k][0] = vGapperL[1];
          ptr_04[k][1] = vGapper[0];
          ptr_05[k][0] = _segNum;
          ptr_05[k][1] = vGapperL[0];
          auVar89._8_8_ = uVar12;
          auVar89._0_8_ = uVar9;
          register0x00001200 = psubsw(stack0xffffffffffffee48,auVar89);
          auVar88._8_8_ = 0x1000100010001;
          auVar88._0_8_ = 0x1000100010001;
          _segNum = paddsw(_segNum,auVar88);
        }
        local_11cc = 0;
        for (k = 0; k < iVar74; k = k + 1) {
          for (local_11d0 = 0; local_11d0 < 8; local_11d0 = local_11d0 + 1) {
            iVar75 = -(gap * (local_11d0 * iVar74 + k)) - open;
            if (iVar75 < -0x8000) {
              iVar75 = -0x8000;
            }
            *(short *)((long)&tmp + (long)local_11d0 * 2) = (short)iVar75;
          }
          ptr[local_11cc][0] = tmp;
          ptr[local_11cc][1] = h.m[0];
          local_11cc = local_11cc + 1;
        }
        *ptr_06 = 0;
        for (k = 1; k <= s2Len; k = k + 1) {
          iVar75 = -(gap * (k + -1)) - open;
          if (iVar75 < -0x8000) {
            iVar75 = -0x8000;
          }
          ptr_06[k] = (int16_t)iVar75;
        }
        vNegInfFront[1] = lVar10;
        vSaturationCheckMax[0] = lVar13;
        for (s1Len = 0; s1Len < s2Len; s1Len = s1Len + 1) {
          uVar101 = ptr[iVar74 + -1][0];
          uVar100 = b_03[iVar74 + -1][0];
          uVar14 = b_04[iVar74 + -1][0];
          uVar15 = b_05[iVar74 + -1][0];
          vHpM[0] = b_03[iVar74 + -1][1] << 0x10 | uVar100 >> 0x30;
          vHpS[1] = uVar100 << 0x10;
          vHpS[0] = b_04[iVar74 + -1][1] << 0x10 | uVar14 >> 0x30;
          vHpL[1] = uVar14 << 0x10;
          vHpL[0] = b_05[iVar74 + -1][1] << 0x10 | uVar15 >> 0x30;
          pvW = (__m128i *)(uVar15 << 0x10);
          vHp[0] = ptr[iVar74 + -1][1] << 0x10 | uVar101 >> 0x30;
          vHpM[1] = uVar101 << 0x10 | (ulong)(ushort)ptr_06[s1Len];
          iVar75 = ppVar4->mapper[(byte)s2[s1Len]];
          iVar2 = ppVar4->mapper[(byte)s2[s1Len]];
          iVar3 = ppVar4->mapper[(byte)s2[s1Len]];
          auVar90._8_8_ = lVar13;
          auVar90._0_8_ = lVar10;
          register0x00001200 = psubsw(auVar90,(undefined1  [16])*ptr_04);
          vF[0] = lVar13;
          vF_ext[1] = lVar10;
          stack0xffffffffffffed28 = ZEXT816(0);
          stack0xffffffffffffed18 = ZEXT816(0);
          stack0xffffffffffffed08 = ZEXT816(0);
          k = 0;
          while( true ) {
            auVar86 = stack0xffffffffffffed98;
            local_7b8 = (short)vF_ext[1];
            sStack_7b6 = vF_ext[1]._2_2_;
            sStack_7b4 = vF_ext[1]._4_2_;
            sStack_952 = vF_ext[1]._6_2_;
            sStack_7b0 = (short)vF_ext[2];
            sStack_94e = vF_ext[2]._2_2_;
            sStack_94c = vF_ext[2]._4_2_;
            sStack_94a = vF_ext[2]._6_2_;
            if (iVar74 <= k) break;
            alVar113 = ptr[k];
            alVar114 = b_03[k];
            alVar115 = b_04[k];
            alVar116 = b_05[k];
            auVar31._8_8_ = uVar11;
            auVar31._0_8_ = uVar8;
            auVar86 = psubsw((undefined1  [16])ptr[k],auVar31);
            auVar30._8_8_ = uVar12;
            auVar30._0_8_ = uVar9;
            auVar87 = psubsw((undefined1  [16])b[k],auVar30);
            local_938 = auVar86._0_2_;
            sStack_936 = auVar86._2_2_;
            sStack_934 = auVar86._4_2_;
            sStack_932 = auVar86._6_2_;
            sStack_930 = auVar86._8_2_;
            sStack_92e = auVar86._10_2_;
            sStack_92c = auVar86._12_2_;
            sStack_92a = auVar86._14_2_;
            local_948 = auVar87._0_2_;
            sStack_946 = auVar87._2_2_;
            sStack_944 = auVar87._4_2_;
            sStack_942 = auVar87._6_2_;
            sStack_940 = auVar87._8_2_;
            sStack_93e = auVar87._10_2_;
            sStack_93c = auVar87._12_2_;
            sStack_93a = auVar87._14_2_;
            case2[1]._0_4_ =
                 CONCAT22(-(ushort)(sStack_946 < sStack_936),-(ushort)(local_948 < local_938));
            case2[1]._0_6_ = CONCAT24(-(ushort)(sStack_944 < sStack_934),(undefined4)case2[1]);
            case2[1] = CONCAT26(-(ushort)(sStack_942 < sStack_932),(undefined6)case2[1]);
            case1[0]._0_4_ =
                 CONCAT22(-(ushort)(sStack_93e < sStack_92e),-(ushort)(sStack_940 < sStack_930));
            case1[0]._0_6_ = CONCAT24(-(ushort)(sStack_93c < sStack_92c),(undefined4)case1[0]);
            case1[0] = CONCAT26(-(ushort)(sStack_93a < sStack_92a),(undefined6)case1[0]);
            uVar78 = (ushort)(local_938 < local_948) * local_948 |
                     (ushort)(local_938 >= local_948) * local_938;
            uVar91 = (ushort)(sStack_936 < sStack_946) * sStack_946 |
                     (ushort)(sStack_936 >= sStack_946) * sStack_936;
            uVar93 = (ushort)(sStack_934 < sStack_944) * sStack_944 |
                     (ushort)(sStack_934 >= sStack_944) * sStack_934;
            uVar95 = (ushort)(sStack_932 < sStack_942) * sStack_942 |
                     (ushort)(sStack_932 >= sStack_942) * sStack_932;
            uVar97 = (ushort)(sStack_930 < sStack_940) * sStack_940 |
                     (ushort)(sStack_930 >= sStack_940) * sStack_930;
            uVar102 = (ushort)(sStack_92e < sStack_93e) * sStack_93e |
                      (ushort)(sStack_92e >= sStack_93e) * sStack_92e;
            uVar105 = (ushort)(sStack_92c < sStack_93c) * sStack_93c |
                      (ushort)(sStack_92c >= sStack_93c) * sStack_92c;
            uVar108 = (ushort)(sStack_92a < sStack_93a) * sStack_93a |
                      (ushort)(sStack_92a >= sStack_93a) * sStack_92a;
            vE_ext[1] = CONCAT26(uVar95,CONCAT24(uVar93,CONCAT22(uVar91,uVar78)));
            vE[0] = CONCAT26(uVar108,CONCAT24(uVar105,CONCAT22(uVar102,uVar97)));
            auVar68._8_8_ = case1[0];
            auVar68._0_8_ = case2[1];
            auVar111 = pblendvb((undefined1  [16])b_00[k],(undefined1  [16])b_03[k],auVar68);
            auVar67._8_8_ = case1[0];
            auVar67._0_8_ = case2[1];
            auVar112 = pblendvb((undefined1  [16])b_01[k],(undefined1  [16])b_04[k],auVar67);
            auVar66._8_8_ = case1[0];
            auVar66._0_8_ = case2[1];
            auVar86 = pblendvb((undefined1  [16])b_02[k],(undefined1  [16])b_05[k],auVar66);
            auVar26._8_8_ = 0x1000100010001;
            auVar26._0_8_ = 0x1000100010001;
            auVar86 = paddsw(auVar86,auVar26);
            auVar87 = paddsw(stack0xffffffffffffed98,(undefined1  [16])ptr_04[k]);
            local_968 = auVar87._0_2_;
            sStack_966 = auVar87._2_2_;
            sStack_964 = auVar87._4_2_;
            sStack_962 = auVar87._6_2_;
            sStack_960 = auVar87._8_2_;
            sStack_95e = auVar87._10_2_;
            sStack_95c = auVar87._12_2_;
            sStack_95a = auVar87._14_2_;
            uVar101 = CONCAT26(-(ushort)(sStack_962 < sStack_952),
                               CONCAT24(-(ushort)(sStack_964 < sStack_7b4),
                                        CONCAT22(-(ushort)(sStack_966 < sStack_7b6),
                                                 -(ushort)(local_968 < local_7b8)))) |
                      CONCAT26(-(ushort)(sStack_952 == sStack_962),
                               CONCAT24(-(ushort)(sStack_7b4 == sStack_964),
                                        CONCAT22(-(ushort)(sStack_7b6 == sStack_966),
                                                 -(ushort)(local_7b8 == local_968))));
            uVar100 = CONCAT26(-(ushort)(sStack_95a < sStack_94a),
                               CONCAT24(-(ushort)(sStack_95c < sStack_94c),
                                        CONCAT22(-(ushort)(sStack_95e < sStack_94e),
                                                 -(ushort)(sStack_960 < sStack_7b0)))) |
                      CONCAT26(-(ushort)(sStack_94a == sStack_95a),
                               CONCAT24(-(ushort)(sStack_94c == sStack_95c),
                                        CONCAT22(-(ushort)(sStack_94e == sStack_95e),
                                                 -(ushort)(sStack_7b0 == sStack_960))));
            vF_ext[1]._0_4_ =
                 CONCAT22((ushort)(sStack_7b6 < sStack_966) * sStack_966 |
                          (ushort)(sStack_7b6 >= sStack_966) * sStack_7b6,
                          (ushort)(local_7b8 < local_968) * local_968 |
                          (ushort)(local_7b8 >= local_968) * local_7b8);
            vF_ext[1]._0_6_ =
                 CONCAT24((ushort)(sStack_7b4 < sStack_964) * sStack_964 |
                          (ushort)(sStack_7b4 >= sStack_964) * sStack_7b4,(undefined4)vF_ext[1]);
            vF_ext[1] = CONCAT26((ushort)(sStack_952 < sStack_962) * sStack_962 |
                                 (ushort)(sStack_952 >= sStack_962) * sStack_952,
                                 (undefined6)vF_ext[1]);
            vF[0]._0_2_ = (ushort)(sStack_7b0 < sStack_960) * sStack_960 |
                          (ushort)(sStack_7b0 >= sStack_960) * sStack_7b0;
            vF[0]._2_2_ = (ushort)(sStack_94e < sStack_95e) * sStack_95e |
                          (ushort)(sStack_94e >= sStack_95e) * sStack_94e;
            vF[0]._4_2_ = (ushort)(sStack_94c < sStack_95c) * sStack_95c |
                          (ushort)(sStack_94c >= sStack_95c) * sStack_94c;
            vF[0]._6_2_ = (ushort)(sStack_94a < sStack_95a) * sStack_95a |
                          (ushort)(sStack_94a >= sStack_95a) * sStack_94a;
            auVar65._8_8_ = uVar100;
            auVar65._0_8_ = uVar101;
            register0x00001240 = pblendvb(stack0xffffffffffffed88,stack0xffffffffffffed28,auVar65);
            auVar64._8_8_ = uVar100;
            auVar64._0_8_ = uVar101;
            register0x00001240 = pblendvb(stack0xffffffffffffed78,stack0xffffffffffffed18,auVar64);
            auVar87 = paddsw(stack0xffffffffffffed68,(undefined1  [16])ptr_05[k]);
            auVar63._8_8_ = uVar100;
            auVar63._0_8_ = uVar101;
            register0x00001240 = pblendvb(auVar87,stack0xffffffffffffed08,auVar63);
            auVar87 = paddsw((undefined1  [16])stack0xffffffffffffecb8,
                             *(undefined1 (*) [16])
                              ((long)pvVar5 + (long)k * 0x10 + (long)(iVar75 * iVar74) * 0x10));
            auVar88 = paddsw((undefined1  [16])stack0xffffffffffffeca8,
                             *(undefined1 (*) [16])
                              ((long)pvVar6 + (long)k * 0x10 + (long)(iVar2 * iVar74) * 0x10));
            auVar89 = paddsw((undefined1  [16])stack0xffffffffffffec98,
                             *(undefined1 (*) [16])
                              ((long)pvVar7 + (long)k * 0x10 + (long)(iVar3 * iVar74) * 0x10));
            auVar25._8_8_ = 0x1000100010001;
            auVar25._0_8_ = 0x1000100010001;
            auVar90 = paddsw((undefined1  [16])_pvW,auVar25);
            vHpM[1] = auVar87._0_8_;
            vHp[0] = auVar87._8_8_;
            local_988 = auVar87._0_2_;
            sStack_986 = auVar87._2_2_;
            sStack_984 = auVar87._4_2_;
            sStack_982 = auVar87._6_2_;
            sStack_980 = auVar87._8_2_;
            sStack_97e = auVar87._10_2_;
            sStack_97c = auVar87._12_2_;
            sStack_97a = auVar87._14_2_;
            case2[1]._0_4_ =
                 CONCAT22(-(ushort)(sStack_986 < (short)uVar91),-(ushort)(local_988 < (short)uVar78)
                         );
            case2[1]._0_6_ = CONCAT24(-(ushort)(sStack_984 < (short)uVar93),(undefined4)case2[1]);
            case2[1] = CONCAT26(-(ushort)(sStack_982 < (short)uVar95),(undefined6)case2[1]);
            case1[0]._0_4_ =
                 CONCAT22(-(ushort)(sStack_97e < (short)uVar102),
                          -(ushort)(sStack_980 < (short)uVar97));
            case1[0]._0_6_ = CONCAT24(-(ushort)(sStack_97c < (short)uVar105),(undefined4)case1[0]);
            case1[0] = CONCAT26(-(ushort)(sStack_97a < (short)uVar108),(undefined6)case1[0]);
            vHtM[1] = CONCAT26((ushort)((short)uVar95 < sStack_982) * sStack_982 |
                               ((short)uVar95 >= sStack_982) * uVar95,
                               CONCAT24((ushort)((short)uVar93 < sStack_984) * sStack_984 |
                                        ((short)uVar93 >= sStack_984) * uVar93,
                                        CONCAT22((ushort)((short)uVar91 < sStack_986) * sStack_986 |
                                                 ((short)uVar91 >= sStack_986) * uVar91,
                                                 (ushort)((short)uVar78 < local_988) * local_988 |
                                                 ((short)uVar78 >= local_988) * uVar78)));
            vHt[0]._0_2_ = (ushort)((short)uVar97 < sStack_980) * sStack_980 |
                           ((short)uVar97 >= sStack_980) * uVar97;
            vHt[0]._2_2_ = (ushort)((short)uVar102 < sStack_97e) * sStack_97e |
                           ((short)uVar102 >= sStack_97e) * uVar102;
            vHt[0]._4_2_ = (ushort)((short)uVar105 < sStack_97c) * sStack_97c |
                           ((short)uVar105 >= sStack_97c) * uVar105;
            vHt[0]._6_2_ = (ushort)((short)uVar108 < sStack_97a) * sStack_97a |
                           ((short)uVar108 >= sStack_97a) * uVar108;
            vHpS[1] = auVar88._0_8_;
            vHpM[0] = auVar88._8_8_;
            vES[1] = auVar111._0_8_;
            vEM[0] = auVar111._8_8_;
            auVar62._8_8_ = case1[0];
            auVar62._0_8_ = case2[1];
            register0x00001240 = pblendvb(auVar88,auVar111,auVar62);
            vHpL[1] = auVar89._0_8_;
            vHpS[0] = auVar89._8_8_;
            vEL[1] = auVar112._0_8_;
            vES[0] = auVar112._8_8_;
            auVar61._8_8_ = case1[0];
            auVar61._0_8_ = case2[1];
            register0x00001240 = pblendvb(auVar89,auVar112,auVar61);
            pvW = auVar90._0_8_;
            vHpL[0] = auVar90._8_8_;
            vHt[1] = auVar86._0_8_;
            vEL[0] = auVar86._8_8_;
            auVar60._8_8_ = case1[0];
            auVar60._0_8_ = case2[1];
            register0x00001240 = pblendvb(auVar90,auVar86,auVar60);
            b[k][0] = vE_ext[1];
            b[k][1] = vE[0];
            b_00[k][0] = vES[1];
            b_00[k][1] = vEM[0];
            b_01[k][0] = vEL[1];
            b_01[k][1] = vES[0];
            b_02[k][0] = vHt[1];
            b_02[k][1] = vEL[0];
            ptr[k][0] = vHpM[1];
            ptr[k][1] = vHp[0];
            b_03[k][0] = vHpS[1];
            b_03[k][1] = vHpM[0];
            b_04[k][0] = vHpL[1];
            b_04[k][1] = vHpS[0];
            b_05[k][0] = (longlong)pvW;
            b_05[k][1] = vHpL[0];
            k = k + 1;
            _pvW = alVar116;
            unique0x10005e12 = alVar115;
            unique0x10005e32 = alVar114;
            unique0x10005e52 = alVar113;
          }
          uVar101 = vHt[0] << 0x10 | (ulong)vHtM[1] >> 0x30;
          vHt[0] = uVar101;
          vHtM[1] = vHtM[1] << 0x10;
          lVar79 = vHtS[1] << 0x10;
          vHtM[0] = vHtM[0] << 0x10 | (ulong)vHtS[1] >> 0x30;
          vHtS[1] = lVar79;
          lVar80 = vHtL[1] << 0x10;
          vHtS[0] = vHtS[0] << 0x10 | (ulong)vHtL[1] >> 0x30;
          vHtL[1] = lVar80;
          lVar81 = vF[1] << 0x10;
          vHtL[0] = vHtL[0] << 0x10 | (ulong)vF[1] >> 0x30;
          vF[1] = lVar81;
          sVar73 = ptr_06[(long)s1Len + 1];
          vHtM[1]._0_2_ = sVar73;
          auVar112._8_8_ = uVar101;
          auVar112._0_8_ = vHtM[1];
          auVar87 = paddsw(auVar112,(undefined1  [16])*ptr_04);
          local_998 = auVar87._0_2_;
          sStack_996 = auVar87._2_2_;
          sStack_994 = auVar87._4_2_;
          sStack_992 = auVar87._6_2_;
          sStack_990 = auVar87._8_2_;
          sStack_98e = auVar87._10_2_;
          sStack_98c = auVar87._12_2_;
          sStack_98a = auVar87._14_2_;
          uVar101 = CONCAT26(-(ushort)(sStack_952 < sStack_992),
                             CONCAT24(-(ushort)(sStack_7b4 < sStack_994),
                                      CONCAT22(-(ushort)(sStack_7b6 < sStack_996),
                                               -(ushort)(local_7b8 < local_998)))) |
                    CONCAT26(-(ushort)(sStack_992 == sStack_952),
                             CONCAT24(-(ushort)(sStack_994 == sStack_7b4),
                                      CONCAT22(-(ushort)(sStack_996 == sStack_7b6),
                                               -(ushort)(local_998 == local_7b8))));
          uVar100 = CONCAT26(-(ushort)(sStack_94a < sStack_98a),
                             CONCAT24(-(ushort)(sStack_94c < sStack_98c),
                                      CONCAT22(-(ushort)(sStack_94e < sStack_98e),
                                               -(ushort)(sStack_7b0 < sStack_990)))) |
                    CONCAT26(-(ushort)(sStack_98a == sStack_94a),
                             CONCAT24(-(ushort)(sStack_98c == sStack_94c),
                                      CONCAT22(-(ushort)(sStack_98e == sStack_94e),
                                               -(ushort)(sStack_990 == sStack_7b0))));
          vF_ext[1]._0_4_ =
               CONCAT22((ushort)(sStack_7b6 < sStack_996) * sStack_996 |
                        (ushort)(sStack_7b6 >= sStack_996) * sStack_7b6,
                        (ushort)(local_7b8 < local_998) * local_998 |
                        (ushort)(local_7b8 >= local_998) * local_7b8);
          vF_ext[1]._0_6_ =
               CONCAT24((ushort)(sStack_7b4 < sStack_994) * sStack_994 |
                        (ushort)(sStack_7b4 >= sStack_994) * sStack_7b4,(undefined4)vF_ext[1]);
          vF_ext[1] = CONCAT26((ushort)(sStack_952 < sStack_992) * sStack_992 |
                               (ushort)(sStack_952 >= sStack_992) * sStack_952,(undefined6)vF_ext[1]
                              );
          vF[0]._0_2_ = (ushort)(sStack_7b0 < sStack_990) * sStack_990 |
                        (ushort)(sStack_7b0 >= sStack_990) * sStack_7b0;
          vF[0]._2_2_ = (ushort)(sStack_94e < sStack_98e) * sStack_98e |
                        (ushort)(sStack_94e >= sStack_98e) * sStack_94e;
          vF[0]._4_2_ = (ushort)(sStack_94c < sStack_98c) * sStack_98c |
                        (ushort)(sStack_94c >= sStack_98c) * sStack_94c;
          vF[0]._6_2_ = (ushort)(sStack_94a < sStack_98a) * sStack_98a |
                        (ushort)(sStack_94a >= sStack_98a) * sStack_94a;
          auVar59._8_8_ = vHtM[0];
          auVar59._0_8_ = lVar79;
          auVar58._8_8_ = uVar100;
          auVar58._0_8_ = uVar101;
          register0x00001240 = pblendvb(stack0xffffffffffffed28,auVar59,auVar58);
          auVar57._8_8_ = vHtS[0];
          auVar57._0_8_ = lVar80;
          auVar56._8_8_ = uVar100;
          auVar56._0_8_ = uVar101;
          register0x00001240 = pblendvb(stack0xffffffffffffed18,auVar57,auVar56);
          auVar111._8_8_ = vHtL[0];
          auVar111._0_8_ = lVar81;
          auVar87 = paddsw(auVar111,(undefined1  [16])*ptr_05);
          auVar55._8_8_ = uVar100;
          auVar55._0_8_ = uVar101;
          register0x00001240 = pblendvb(stack0xffffffffffffed08,auVar87,auVar55);
          k = 0;
          while( true ) {
            if (5 < k) break;
            auVar24._8_8_ = vF[0] << 0x10 | (ulong)vF_ext[1] >> 0x30;
            auVar24._0_8_ = vF_ext[1] << 0x10;
            auVar87 = paddsw(auVar24,auVar85);
            local_9b8 = auVar87._0_2_;
            sStack_9b6 = auVar87._2_2_;
            sStack_9b4 = auVar87._4_2_;
            sStack_9b2 = auVar87._6_2_;
            sStack_9b0 = auVar87._8_2_;
            sStack_9ae = auVar87._10_2_;
            sStack_9ac = auVar87._12_2_;
            sStack_9aa = auVar87._14_2_;
            local_9c8 = (short)vF_ext[1];
            sStack_9c6 = vF_ext[1]._2_2_;
            sStack_9c4 = vF_ext[1]._4_2_;
            sStack_9c2 = vF_ext[1]._6_2_;
            sStack_9c0 = (short)vF_ext[2];
            sStack_9be = vF_ext[2]._2_2_;
            sStack_9bc = vF_ext[2]._4_2_;
            sStack_9ba = vF_ext[2]._6_2_;
            uVar101 = CONCAT26(-(ushort)(sStack_9c2 < sStack_9b2),
                               CONCAT24(-(ushort)(sStack_9c4 < sStack_9b4),
                                        CONCAT22(-(ushort)(sStack_9c6 < sStack_9b6),
                                                 -(ushort)(local_9c8 < local_9b8)))) |
                      CONCAT26(-(ushort)(sStack_9b2 == sStack_9c2),
                               CONCAT24(-(ushort)(sStack_9b4 == sStack_9c4),
                                        CONCAT22(-(ushort)(sStack_9b6 == sStack_9c6),
                                                 -(ushort)(local_9b8 == local_9c8))));
            uVar100 = CONCAT26(-(ushort)(sStack_9ba < sStack_9aa),
                               CONCAT24(-(ushort)(sStack_9bc < sStack_9ac),
                                        CONCAT22(-(ushort)(sStack_9be < sStack_9ae),
                                                 -(ushort)(sStack_9c0 < sStack_9b0)))) |
                      CONCAT26(-(ushort)(sStack_9aa == sStack_9ba),
                               CONCAT24(-(ushort)(sStack_9ac == sStack_9bc),
                                        CONCAT22(-(ushort)(sStack_9ae == sStack_9be),
                                                 -(ushort)(sStack_9b0 == sStack_9c0))));
            vF_ext[1]._0_4_ =
                 CONCAT22((ushort)(sStack_9c6 < sStack_9b6) * sStack_9b6 |
                          (ushort)(sStack_9c6 >= sStack_9b6) * sStack_9c6,
                          (ushort)(local_9c8 < local_9b8) * local_9b8 |
                          (ushort)(local_9c8 >= local_9b8) * local_9c8);
            vF_ext[1]._0_6_ =
                 CONCAT24((ushort)(sStack_9c4 < sStack_9b4) * sStack_9b4 |
                          (ushort)(sStack_9c4 >= sStack_9b4) * sStack_9c4,(undefined4)vF_ext[1]);
            vF_ext[1] = CONCAT26((ushort)(sStack_9c2 < sStack_9b2) * sStack_9b2 |
                                 (ushort)(sStack_9c2 >= sStack_9b2) * sStack_9c2,
                                 (undefined6)vF_ext[1]);
            vF[0]._0_2_ = (ushort)(sStack_9c0 < sStack_9b0) * sStack_9b0 |
                          (ushort)(sStack_9c0 >= sStack_9b0) * sStack_9c0;
            vF[0]._2_2_ = (ushort)(sStack_9be < sStack_9ae) * sStack_9ae |
                          (ushort)(sStack_9be >= sStack_9ae) * sStack_9be;
            vF[0]._4_2_ = (ushort)(sStack_9bc < sStack_9ac) * sStack_9ac |
                          (ushort)(sStack_9bc >= sStack_9ac) * sStack_9bc;
            vF[0]._6_2_ = (ushort)(sStack_9ba < sStack_9aa) * sStack_9aa |
                          (ushort)(sStack_9ba >= sStack_9aa) * sStack_9ba;
            auVar54._8_8_ = vFM[0] << 0x10 | (ulong)vFS[1] >> 0x30;
            auVar54._0_8_ = vFS[1] << 0x10;
            auVar53._8_8_ = uVar100;
            auVar53._0_8_ = uVar101;
            register0x00001240 = pblendvb(stack0xffffffffffffed28,auVar54,auVar53);
            auVar52._8_8_ = vFS[0] << 0x10 | (ulong)vFL[1] >> 0x30;
            auVar52._0_8_ = vFL[1] << 0x10;
            auVar51._8_8_ = uVar100;
            auVar51._0_8_ = uVar101;
            register0x00001240 = pblendvb(stack0xffffffffffffed18,auVar52,auVar51);
            auVar23._8_8_ = vFL[0] << 0x10 | (ulong)vH[1] >> 0x30;
            auVar23._0_8_ = vH[1] << 0x10;
            auVar70._14_2_ = 0;
            auVar87 = paddsw(auVar23,auVar70 << 0x10);
            auVar50._8_8_ = uVar100;
            auVar50._0_8_ = uVar101;
            register0x00001240 = pblendvb(stack0xffffffffffffed08,auVar87,auVar50);
            k = k + 1;
          }
          lVar82 = vFS[1] << 0x10;
          vFM[0] = vFM[0] << 0x10 | (ulong)vFS[1] >> 0x30;
          vFS[1] = lVar82;
          lVar83 = vFL[1] << 0x10;
          vFS[0] = vFS[0] << 0x10 | (ulong)vFL[1] >> 0x30;
          vFL[1] = lVar83;
          lVar84 = vH[1] << 0x10;
          vFL[0] = vFL[0] << 0x10 | (ulong)vH[1] >> 0x30;
          vH[1] = lVar84;
          auVar22._8_8_ = vF[0] << 0x10 | (ulong)vF_ext[1] >> 0x30;
          auVar22._0_8_ = vF_ext[1] << 0x10;
          auVar21._8_8_ = 0;
          auVar21._0_8_ = CONCAT62(0,uVar71);
          register0x00001200 = paddsw(auVar22,auVar21);
          local_9d8 = (short)vF_ext[1];
          sStack_9d6 = vF_ext[1]._2_2_;
          sStack_9d4 = vF_ext[1]._4_2_;
          sStack_9d2 = vF_ext[1]._6_2_;
          sStack_9d0 = (short)vF_ext[2];
          sStack_9ce = vF_ext[2]._2_2_;
          sStack_9cc = vF_ext[2]._4_2_;
          sStack_9ca = vF_ext[2]._6_2_;
          sStack_9e6 = auVar86._0_2_;
          sStack_9e4 = auVar86._2_2_;
          sStack_9e2 = auVar86._4_2_;
          sStack_9e0 = auVar86._6_2_;
          sStack_9de = auVar86._8_2_;
          sStack_9dc = auVar86._10_2_;
          sStack_9da = auVar86._12_2_;
          case2[1]._0_4_ =
               CONCAT22(-(ushort)(sStack_9e6 < sStack_9d6),-(ushort)(sVar73 < local_9d8));
          case2[1]._0_6_ = CONCAT24(-(ushort)(sStack_9e4 < sStack_9d4),(undefined4)case2[1]);
          case2[1] = CONCAT26(-(ushort)(sStack_9e2 < sStack_9d2),(undefined6)case2[1]);
          case1[0]._0_4_ =
               CONCAT22(-(ushort)(sStack_9de < sStack_9ce),-(ushort)(sStack_9e0 < sStack_9d0));
          case1[0]._0_6_ = CONCAT24(-(ushort)(sStack_9dc < sStack_9cc),(undefined4)case1[0]);
          case1[0] = CONCAT26(-(ushort)(sStack_9da < sStack_9ca),(undefined6)case1[0]);
          vHM[1]._0_4_ = CONCAT22((ushort)(sStack_9d6 < sStack_9e6) * sStack_9e6 |
                                  (ushort)(sStack_9d6 >= sStack_9e6) * sStack_9d6,
                                  (ushort)(local_9d8 < sVar73) * sVar73 |
                                  (ushort)(local_9d8 >= sVar73) * local_9d8);
          vHM[1]._0_6_ = CONCAT24((ushort)(sStack_9d4 < sStack_9e4) * sStack_9e4 |
                                  (ushort)(sStack_9d4 >= sStack_9e4) * sStack_9d4,(undefined4)vHM[1]
                                 );
          vHM[1] = CONCAT26((ushort)(sStack_9d2 < sStack_9e2) * sStack_9e2 |
                            (ushort)(sStack_9d2 >= sStack_9e2) * sStack_9d2,(undefined6)vHM[1]);
          vH[0]._0_4_ = CONCAT22((ushort)(sStack_9ce < sStack_9de) * sStack_9de |
                                 (ushort)(sStack_9ce >= sStack_9de) * sStack_9ce,
                                 (ushort)(sStack_9d0 < sStack_9e0) * sStack_9e0 |
                                 (ushort)(sStack_9d0 >= sStack_9e0) * sStack_9d0);
          vH[0]._0_6_ = CONCAT24((ushort)(sStack_9cc < sStack_9dc) * sStack_9dc |
                                 (ushort)(sStack_9cc >= sStack_9dc) * sStack_9cc,(undefined4)vH[0]);
          vH[0] = CONCAT26((ushort)(sStack_9ca < sStack_9da) * sStack_9da |
                           (ushort)(sStack_9ca >= sStack_9da) * sStack_9ca,(undefined6)vH[0]);
          auVar49._8_8_ = vHtM[0];
          auVar49._0_8_ = lVar79;
          auVar48._8_8_ = vFM[0];
          auVar48._0_8_ = lVar82;
          auVar47._8_8_ = case1[0];
          auVar47._0_8_ = case2[1];
          register0x00001240 = pblendvb(auVar49,auVar48,auVar47);
          auVar46._8_8_ = vHtS[0];
          auVar46._0_8_ = lVar80;
          auVar45._8_8_ = vFS[0];
          auVar45._0_8_ = lVar83;
          auVar44._8_8_ = case1[0];
          auVar44._0_8_ = case2[1];
          register0x00001240 = pblendvb(auVar46,auVar45,auVar44);
          auVar43._8_8_ = vHtL[0];
          auVar43._0_8_ = lVar81;
          auVar42._8_8_ = vFL[0];
          auVar42._0_8_ = lVar84;
          auVar41._8_8_ = case1[0];
          auVar41._0_8_ = case2[1];
          register0x00001240 = pblendvb(auVar43,auVar42,auVar41);
          for (k = 0; k < iVar74; k = k + 1) {
            lVar16 = ptr[k][0];
            lVar17 = ptr[k][1];
            lVar18 = b[k][0];
            lVar19 = b[k][1];
            auVar29._8_8_ = vH[0];
            auVar29._0_8_ = vHM[1];
            auVar28._8_8_ = uVar11;
            auVar28._0_8_ = uVar8;
            auVar86 = psubsw(auVar29,auVar28);
            auVar27._8_8_ = uVar12;
            auVar27._0_8_ = uVar9;
            auVar87 = psubsw(stack0xffffffffffffed58,auVar27);
            local_858 = auVar86._0_2_;
            sStack_856 = auVar86._2_2_;
            sStack_854 = auVar86._4_2_;
            sStack_852 = auVar86._6_2_;
            sStack_850 = auVar86._8_2_;
            sStack_84e = auVar86._10_2_;
            sStack_84c = auVar86._12_2_;
            sStack_84a = auVar86._14_2_;
            local_868 = auVar87._0_2_;
            sStack_866 = auVar87._2_2_;
            sStack_864 = auVar87._4_2_;
            sStack_862 = auVar87._6_2_;
            sStack_860 = auVar87._8_2_;
            sStack_85e = auVar87._10_2_;
            sStack_85c = auVar87._12_2_;
            sStack_85a = auVar87._14_2_;
            uVar78 = (ushort)(local_858 < local_868) * local_868 |
                     (ushort)(local_858 >= local_868) * local_858;
            uVar93 = (ushort)(sStack_856 < sStack_866) * sStack_866 |
                     (ushort)(sStack_856 >= sStack_866) * sStack_856;
            uVar97 = (ushort)(sStack_854 < sStack_864) * sStack_864 |
                     (ushort)(sStack_854 >= sStack_864) * sStack_854;
            uVar105 = (ushort)(sStack_852 < sStack_862) * sStack_862 |
                      (ushort)(sStack_852 >= sStack_862) * sStack_852;
            vF[0]._0_2_ = (ushort)(sStack_850 < sStack_860) * sStack_860 |
                          (ushort)(sStack_850 >= sStack_860) * sStack_850;
            vF[0]._2_2_ = (ushort)(sStack_84e < sStack_85e) * sStack_85e |
                          (ushort)(sStack_84e >= sStack_85e) * sStack_84e;
            vF[0]._4_2_ = (ushort)(sStack_84c < sStack_85c) * sStack_85c |
                          (ushort)(sStack_84c >= sStack_85c) * sStack_84c;
            vF[0]._6_2_ = (ushort)(sStack_84a < sStack_85a) * sStack_85a |
                          (ushort)(sStack_84a >= sStack_85a) * sStack_84a;
            vF_ext[1]._0_4_ = CONCAT22(uVar93,uVar78);
            vF_ext[1]._0_6_ = CONCAT24(uVar97,(undefined4)vF_ext[1]);
            vF_ext[1] = CONCAT26(uVar105,(undefined6)vF_ext[1]);
            case2[1]._0_4_ =
                 CONCAT22(-(ushort)(sStack_866 < sStack_856),-(ushort)(local_868 < local_858));
            case2[1]._0_6_ = CONCAT24(-(ushort)(sStack_864 < sStack_854),(undefined4)case2[1]);
            case2[1] = CONCAT26(-(ushort)(sStack_862 < sStack_852),(undefined6)case2[1]);
            case1[0]._0_4_ =
                 CONCAT22(-(ushort)(sStack_85e < sStack_84e),-(ushort)(sStack_860 < sStack_850));
            case1[0]._0_6_ = CONCAT24(-(ushort)(sStack_85c < sStack_84c),(undefined4)case1[0]);
            case1[0] = CONCAT26(-(ushort)(sStack_85a < sStack_84a),(undefined6)case1[0]);
            auVar40._8_8_ = case1[0];
            auVar40._0_8_ = case2[1];
            register0x00001240 = pblendvb(stack0xffffffffffffed28,stack0xffffffffffffece8,auVar40);
            auVar39._8_8_ = case1[0];
            auVar39._0_8_ = case2[1];
            register0x00001240 = pblendvb(stack0xffffffffffffed18,stack0xffffffffffffecd8,auVar39);
            auVar38._8_8_ = case1[0];
            auVar38._0_8_ = case2[1];
            auVar86 = pblendvb(stack0xffffffffffffed08,stack0xffffffffffffecc8,auVar38);
            auVar20._8_8_ = 0x1000100010001;
            auVar20._0_8_ = 0x1000100010001;
            register0x00001200 = paddsw(auVar86,auVar20);
            local_878 = (ushort)lVar16;
            uStack_876 = (ushort)((ulong)lVar16 >> 0x10);
            uStack_874 = (ushort)((ulong)lVar16 >> 0x20);
            uStack_872 = (ushort)((ulong)lVar16 >> 0x30);
            uStack_870 = (ushort)lVar17;
            uStack_86e = (ushort)((ulong)lVar17 >> 0x10);
            uStack_86c = (ushort)((ulong)lVar17 >> 0x20);
            uStack_86a = (ushort)((ulong)lVar17 >> 0x30);
            local_888 = (short)lVar18;
            sStack_886 = (short)((ulong)lVar18 >> 0x10);
            sStack_884 = (short)((ulong)lVar18 >> 0x20);
            sStack_882 = (short)((ulong)lVar18 >> 0x30);
            sStack_880 = (short)lVar19;
            sStack_87e = (short)((ulong)lVar19 >> 0x10);
            sStack_87c = (short)((ulong)lVar19 >> 0x20);
            sStack_87a = (short)((ulong)lVar19 >> 0x30);
            uVar91 = (ushort)((short)local_878 < local_888) * local_888 |
                     ((short)local_878 >= local_888) * local_878;
            uVar95 = (ushort)((short)uStack_876 < sStack_886) * sStack_886 |
                     ((short)uStack_876 >= sStack_886) * uStack_876;
            uVar102 = (ushort)((short)uStack_874 < sStack_884) * sStack_884 |
                      ((short)uStack_874 >= sStack_884) * uStack_874;
            uVar108 = (ushort)((short)uStack_872 < sStack_882) * sStack_882 |
                      ((short)uStack_872 >= sStack_882) * uStack_872;
            uVar98 = (ushort)((short)uStack_870 < sStack_880) * sStack_880 |
                     ((short)uStack_870 >= sStack_880) * uStack_870;
            uVar103 = (ushort)((short)uStack_86e < sStack_87e) * sStack_87e |
                      ((short)uStack_86e >= sStack_87e) * uStack_86e;
            uVar106 = (ushort)((short)uStack_86c < sStack_87c) * sStack_87c |
                      ((short)uStack_86c >= sStack_87c) * uStack_86c;
            uVar109 = (ushort)((short)uStack_86a < sStack_87a) * sStack_87a |
                      ((short)uStack_86a >= sStack_87a) * uStack_86a;
            uVar91 = ((short)uVar91 < (short)uVar78) * uVar78 |
                     ((short)uVar91 >= (short)uVar78) * uVar91;
            uVar95 = ((short)uVar95 < (short)uVar93) * uVar93 |
                     ((short)uVar95 >= (short)uVar93) * uVar95;
            uVar102 = ((short)uVar102 < (short)uVar97) * uVar97 |
                      ((short)uVar102 >= (short)uVar97) * uVar102;
            uVar108 = ((short)uVar108 < (short)uVar105) * uVar105 |
                      ((short)uVar108 >= (short)uVar105) * uVar108;
            uVar98 = ((short)uVar98 < (short)(ushort)vF[0]) * (ushort)vF[0] |
                     ((short)uVar98 >= (short)(ushort)vF[0]) * uVar98;
            uVar103 = ((short)uVar103 < (short)vF[0]._2_2_) * vF[0]._2_2_ |
                      ((short)uVar103 >= (short)vF[0]._2_2_) * uVar103;
            uVar106 = ((short)uVar106 < (short)vF[0]._4_2_) * vF[0]._4_2_ |
                      ((short)uVar106 >= (short)vF[0]._4_2_) * uVar106;
            uVar109 = ((short)uVar109 < (short)vF[0]._6_2_) * vF[0]._6_2_ |
                      ((short)uVar109 >= (short)vF[0]._6_2_) * uVar109;
            vHM[1]._0_4_ = CONCAT22(uVar95,uVar91);
            vHM[1]._0_6_ = CONCAT24(uVar102,(undefined4)vHM[1]);
            vHM[1] = CONCAT26(uVar108,(undefined6)vHM[1]);
            vH[0]._0_4_ = CONCAT22(uVar103,uVar98);
            vH[0]._0_6_ = CONCAT24(uVar106,(undefined4)vH[0]);
            vH[0] = CONCAT26(uVar109,(undefined6)vH[0]);
            case2[1]._0_4_ =
                 CONCAT22(-(ushort)(uVar95 == uStack_876),-(ushort)(uVar91 == local_878));
            case2[1]._0_6_ = CONCAT24(-(ushort)(uVar102 == uStack_874),(undefined4)case2[1]);
            case2[1] = CONCAT26(-(ushort)(uVar108 == uStack_872),(undefined6)case2[1]);
            case1[0]._0_4_ =
                 CONCAT22(-(ushort)(uVar103 == uStack_86e),-(ushort)(uVar98 == uStack_870));
            case1[0]._0_6_ = CONCAT24(-(ushort)(uVar106 == uStack_86c),(undefined4)case1[0]);
            case1[0] = CONCAT26(-(ushort)(uVar109 == uStack_86a),(undefined6)case1[0]);
            sVar73 = -(ushort)(uVar91 == uVar78);
            sVar92 = -(ushort)(uVar95 == uVar93);
            sVar94 = -(ushort)(uVar102 == uVar97);
            sVar96 = -(ushort)(uVar108 == uVar105);
            sVar99 = -(ushort)(uVar98 == (ushort)vF[0]);
            sVar104 = -(ushort)(uVar103 == vF[0]._2_2_);
            sVar107 = -(ushort)(uVar106 == vF[0]._4_2_);
            sVar110 = -(ushort)(uVar109 == vF[0]._6_2_);
            auVar37._2_2_ = sVar92;
            auVar37._0_2_ = sVar73;
            auVar37._4_2_ = sVar94;
            auVar37._6_2_ = sVar96;
            auVar37._10_2_ = sVar104;
            auVar37._8_2_ = sVar99;
            auVar37._12_2_ = sVar107;
            auVar37._14_2_ = sVar110;
            auVar86 = pblendvb((undefined1  [16])b_00[k],register0x00001240,auVar37);
            auVar36._8_8_ = case1[0];
            auVar36._0_8_ = case2[1];
            register0x00001240 = pblendvb(auVar86,(undefined1  [16])b_03[k],auVar36);
            auVar35._2_2_ = sVar92;
            auVar35._0_2_ = sVar73;
            auVar35._4_2_ = sVar94;
            auVar35._6_2_ = sVar96;
            auVar35._10_2_ = sVar104;
            auVar35._8_2_ = sVar99;
            auVar35._12_2_ = sVar107;
            auVar35._14_2_ = sVar110;
            auVar86 = pblendvb((undefined1  [16])b_01[k],register0x00001240,auVar35);
            auVar34._8_8_ = case1[0];
            auVar34._0_8_ = case2[1];
            register0x00001240 = pblendvb(auVar86,(undefined1  [16])b_04[k],auVar34);
            auVar33._2_2_ = sVar92;
            auVar33._0_2_ = sVar73;
            auVar33._4_2_ = sVar94;
            auVar33._6_2_ = sVar96;
            auVar33._10_2_ = sVar104;
            auVar33._8_2_ = sVar99;
            auVar33._12_2_ = sVar107;
            auVar33._14_2_ = sVar110;
            auVar86 = pblendvb((undefined1  [16])b_02[k],register0x00001200,auVar33);
            auVar32._8_8_ = case1[0];
            auVar32._0_8_ = case2[1];
            register0x00001240 = pblendvb(auVar86,(undefined1  [16])b_05[k],auVar32);
            ptr[k][0] = vHM[1];
            ptr[k][1] = vH[0];
            b_03[k][0] = vHS[1];
            b_03[k][1] = vHM[0];
            b_04[k][0] = vHL[1];
            b_04[k][1] = vHS[0];
            b_05[k][0] = vHp[1];
            b_05[k][1] = vHL[0];
            local_148 = (short)vSaturationCheckMax[1];
            sStack_146 = (short)((ulong)vSaturationCheckMax[1] >> 0x10);
            sStack_144 = (short)((ulong)vSaturationCheckMax[1] >> 0x20);
            sStack_142 = (short)((ulong)vSaturationCheckMax[1] >> 0x30);
            sStack_140 = (short)vSaturationCheckMin[0];
            sStack_13e = (short)((ulong)vSaturationCheckMin[0] >> 0x10);
            sStack_13c = (short)((ulong)vSaturationCheckMin[0] >> 0x20);
            sStack_13a = (short)((ulong)vSaturationCheckMin[0] >> 0x30);
            vSaturationCheckMax[1] =
                 CONCAT26(((short)uVar108 < sStack_142) * uVar108 |
                          (ushort)((short)uVar108 >= sStack_142) * sStack_142,
                          CONCAT24(((short)uVar102 < sStack_144) * uVar102 |
                                   (ushort)((short)uVar102 >= sStack_144) * sStack_144,
                                   CONCAT22(((short)uVar95 < sStack_146) * uVar95 |
                                            (ushort)((short)uVar95 >= sStack_146) * sStack_146,
                                            ((short)uVar91 < local_148) * uVar91 |
                                            (ushort)((short)uVar91 >= local_148) * local_148)));
            vSaturationCheckMin[0] =
                 CONCAT26(((short)uVar109 < sStack_13a) * uVar109 |
                          (ushort)((short)uVar109 >= sStack_13a) * sStack_13a,
                          CONCAT24(((short)uVar106 < sStack_13c) * uVar106 |
                                   (ushort)((short)uVar106 >= sStack_13c) * sStack_13c,
                                   CONCAT22(((short)uVar103 < sStack_13e) * uVar103 |
                                            (ushort)((short)uVar103 >= sStack_13e) * sStack_13e,
                                            ((short)uVar98 < sStack_140) * uVar98 |
                                            (ushort)((short)uVar98 >= sStack_140) * sStack_140)));
            local_8b8 = (short)vNegInfFront[1];
            sStack_8b6 = (short)((ulong)vNegInfFront[1] >> 0x10);
            sStack_8b4 = (short)((ulong)vNegInfFront[1] >> 0x20);
            sStack_8b2 = (short)((ulong)vNegInfFront[1] >> 0x30);
            sStack_8b0 = (short)vSaturationCheckMax[0];
            sStack_8ae = (short)((ulong)vSaturationCheckMax[0] >> 0x10);
            sStack_8ac = (short)((ulong)vSaturationCheckMax[0] >> 0x20);
            sStack_8aa = (short)((ulong)vSaturationCheckMax[0] >> 0x30);
            uVar78 = (local_8b8 < (short)uVar91) * uVar91 |
                     (ushort)(local_8b8 >= (short)uVar91) * local_8b8;
            uVar91 = (sStack_8b6 < (short)uVar95) * uVar95 |
                     (ushort)(sStack_8b6 >= (short)uVar95) * sStack_8b6;
            uVar93 = (sStack_8b4 < (short)uVar102) * uVar102 |
                     (ushort)(sStack_8b4 >= (short)uVar102) * sStack_8b4;
            uVar95 = (sStack_8b2 < (short)uVar108) * uVar108 |
                     (ushort)(sStack_8b2 >= (short)uVar108) * sStack_8b2;
            uVar97 = (sStack_8b0 < (short)uVar98) * uVar98 |
                     (ushort)(sStack_8b0 >= (short)uVar98) * sStack_8b0;
            uVar102 = (sStack_8ae < (short)uVar103) * uVar103 |
                      (ushort)(sStack_8ae >= (short)uVar103) * sStack_8ae;
            uVar105 = (sStack_8ac < (short)uVar106) * uVar106 |
                      (ushort)(sStack_8ac >= (short)uVar106) * sStack_8ac;
            uVar108 = (sStack_8aa < (short)uVar109) * uVar109 |
                      (ushort)(sStack_8aa >= (short)uVar109) * sStack_8aa;
            local_8e8 = (short)vHS[1];
            sStack_8e6 = vHS[1]._2_2_;
            sStack_8e4 = vHS[1]._4_2_;
            sStack_8e2 = vHS[1]._6_2_;
            sStack_8e0 = (short)vHS[2];
            sStack_8de = vHS[2]._2_2_;
            sStack_8dc = vHS[2]._4_2_;
            sStack_8da = vHS[2]._6_2_;
            uVar78 = (ushort)((short)uVar78 < local_8e8) * local_8e8 |
                     ((short)uVar78 >= local_8e8) * uVar78;
            uVar91 = (ushort)((short)uVar91 < sStack_8e6) * sStack_8e6 |
                     ((short)uVar91 >= sStack_8e6) * uVar91;
            uVar93 = (ushort)((short)uVar93 < sStack_8e4) * sStack_8e4 |
                     ((short)uVar93 >= sStack_8e4) * uVar93;
            uVar95 = (ushort)((short)uVar95 < sStack_8e2) * sStack_8e2 |
                     ((short)uVar95 >= sStack_8e2) * uVar95;
            uVar97 = (ushort)((short)uVar97 < sStack_8e0) * sStack_8e0 |
                     ((short)uVar97 >= sStack_8e0) * uVar97;
            uVar102 = (ushort)((short)uVar102 < sStack_8de) * sStack_8de |
                      ((short)uVar102 >= sStack_8de) * uVar102;
            uVar105 = (ushort)((short)uVar105 < sStack_8dc) * sStack_8dc |
                      ((short)uVar105 >= sStack_8dc) * uVar105;
            uVar108 = (ushort)((short)uVar108 < sStack_8da) * sStack_8da |
                      ((short)uVar108 >= sStack_8da) * uVar108;
            local_908 = (short)vHL[1];
            sStack_906 = vHL[1]._2_2_;
            sStack_904 = vHL[1]._4_2_;
            sStack_902 = vHL[1]._6_2_;
            sStack_900 = (short)vHL[2];
            sStack_8fe = vHL[2]._2_2_;
            sStack_8fc = vHL[2]._4_2_;
            sStack_8fa = vHL[2]._6_2_;
            uVar78 = (ushort)((short)uVar78 < local_908) * local_908 |
                     ((short)uVar78 >= local_908) * uVar78;
            uVar91 = (ushort)((short)uVar91 < sStack_906) * sStack_906 |
                     ((short)uVar91 >= sStack_906) * uVar91;
            uVar93 = (ushort)((short)uVar93 < sStack_904) * sStack_904 |
                     ((short)uVar93 >= sStack_904) * uVar93;
            uVar95 = (ushort)((short)uVar95 < sStack_902) * sStack_902 |
                     ((short)uVar95 >= sStack_902) * uVar95;
            uVar97 = (ushort)((short)uVar97 < sStack_900) * sStack_900 |
                     ((short)uVar97 >= sStack_900) * uVar97;
            uVar102 = (ushort)((short)uVar102 < sStack_8fe) * sStack_8fe |
                      ((short)uVar102 >= sStack_8fe) * uVar102;
            uVar105 = (ushort)((short)uVar105 < sStack_8fc) * sStack_8fc |
                      ((short)uVar105 >= sStack_8fc) * uVar105;
            uVar108 = (ushort)((short)uVar108 < sStack_8fa) * sStack_8fa |
                      ((short)uVar108 >= sStack_8fa) * uVar108;
            local_928 = (short)vHp[1];
            sStack_926 = vHp[1]._2_2_;
            sStack_924 = vHp[1]._4_2_;
            sStack_922 = vHp[1]._6_2_;
            sStack_920 = (short)vHp[2];
            sStack_91e = vHp[2]._2_2_;
            sStack_91c = vHp[2]._4_2_;
            sStack_91a = vHp[2]._6_2_;
            vNegInfFront[1] =
                 CONCAT26((ushort)((short)uVar95 < sStack_922) * sStack_922 |
                          ((short)uVar95 >= sStack_922) * uVar95,
                          CONCAT24((ushort)((short)uVar93 < sStack_924) * sStack_924 |
                                   ((short)uVar93 >= sStack_924) * uVar93,
                                   CONCAT22((ushort)((short)uVar91 < sStack_926) * sStack_926 |
                                            ((short)uVar91 >= sStack_926) * uVar91,
                                            (ushort)((short)uVar78 < local_928) * local_928 |
                                            ((short)uVar78 >= local_928) * uVar78)));
            vSaturationCheckMax[0] =
                 CONCAT26((ushort)((short)uVar108 < sStack_91a) * sStack_91a |
                          ((short)uVar108 >= sStack_91a) * uVar108,
                          CONCAT24((ushort)((short)uVar105 < sStack_91c) * sStack_91c |
                                   ((short)uVar105 >= sStack_91c) * uVar105,
                                   CONCAT22((ushort)((short)uVar102 < sStack_91e) * sStack_91e |
                                            ((short)uVar102 >= sStack_91e) * uVar102,
                                            (ushort)((short)uVar97 < sStack_920) * sStack_920 |
                                            ((short)uVar97 >= sStack_920) * uVar97)));
          }
        }
        vH_1[0] = ptr[iVar77][1];
        vHM_1[0] = b_03[iVar77][1];
        vHS_1[0] = b_04[iVar77][1];
        vHL_1[0] = b_05[iVar77][1];
        uStack_1498 = b_05[iVar77][0];
        vHL_1[1] = b_04[iVar77][0];
        vHS_1[1] = b_03[iVar77][0];
        vHM_1[1] = ptr[iVar77][0];
        for (end_query = 0; end_query < (int)(~((iVar1 + -1) / iVar74) + 8U);
            end_query = end_query + 1) {
          vH_1[0] = vH_1[0] << 0x10 | (ulong)vHM_1[1] >> 0x30;
          vHM_1[0] = vHM_1[0] << 0x10 | (ulong)vHS_1[1] >> 0x30;
          vHS_1[0] = vHS_1[0] << 0x10 | (ulong)vHL_1[1] >> 0x30;
          vHL_1[0] = vHL_1[0] << 0x10 | uStack_1498 >> 0x30;
          uStack_1498 = uStack_1498 << 0x10;
          vHL_1[1] = vHL_1[1] << 0x10;
          vHS_1[1] = vHS_1[1] << 0x10;
          vHM_1[1] = vHM_1[1] << 0x10;
        }
        local_111a = vH_1[0]._6_2_;
        local_111c = vHM_1[0]._6_2_;
        local_111e = vHS_1[0]._6_2_;
        local_1120 = vHL_1[0]._6_2_;
        local_108 = (short)vSaturationCheckMax[1];
        sStack_106 = (short)((ulong)vSaturationCheckMax[1] >> 0x10);
        sStack_104 = (short)((ulong)vSaturationCheckMax[1] >> 0x20);
        sStack_102 = (short)((ulong)vSaturationCheckMax[1] >> 0x30);
        sStack_100 = (short)vSaturationCheckMin[0];
        sStack_fe = (short)((ulong)vSaturationCheckMin[0] >> 0x10);
        sStack_fc = (short)((ulong)vSaturationCheckMin[0] >> 0x20);
        sStack_fa = (short)((ulong)vSaturationCheckMin[0] >> 0x30);
        local_a18 = (short)vNegInfFront[1];
        sStack_a16 = (short)((ulong)vNegInfFront[1] >> 0x10);
        sStack_a14 = (short)((ulong)vNegInfFront[1] >> 0x20);
        sStack_a12 = (short)((ulong)vNegInfFront[1] >> 0x30);
        sStack_a10 = (short)vSaturationCheckMax[0];
        sStack_a0e = (short)((ulong)vSaturationCheckMax[0] >> 0x10);
        sStack_a0c = (short)((ulong)vSaturationCheckMax[0] >> 0x20);
        sStack_a0a = (short)((ulong)vSaturationCheckMax[0] >> 0x30);
        uVar101 = CONCAT26(-(ushort)(sStack_fa < (short)uVar71),
                           CONCAT24(-(ushort)(sStack_fc < (short)uVar71),
                                    CONCAT22(-(ushort)(sStack_fe < (short)uVar71),
                                             -(ushort)(sStack_100 < (short)uVar71)))) |
                  CONCAT26(-(ushort)(sVar72 < sStack_a0a),
                           CONCAT24(-(ushort)(sVar72 < sStack_a0c),
                                    CONCAT22(-(ushort)(sVar72 < sStack_a0e),
                                             -(ushort)(sVar72 < sStack_a10))));
        auVar69._8_8_ = uVar101;
        auVar69._0_8_ =
             CONCAT26(-(ushort)(sStack_102 < (short)uVar71),
                      CONCAT24(-(ushort)(sStack_104 < (short)uVar71),
                               CONCAT22(-(ushort)(sStack_106 < (short)uVar71),
                                        -(ushort)(local_108 < (short)uVar71)))) |
             CONCAT26(-(ushort)(sVar72 < sStack_a12),
                      CONCAT24(-(ushort)(sVar72 < sStack_a14),
                               CONCAT22(-(ushort)(sVar72 < sStack_a16),-(ushort)(sVar72 < local_a18)
                                       )));
        if ((((((((((((((((auVar69 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                         (auVar69 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar69 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar69 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar69 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar69 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar69 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar69 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (uVar101 >> 7 & 1) != 0) || (uVar101 >> 0xf & 1) != 0) ||
                (uVar101 >> 0x17 & 1) != 0) || (uVar101 >> 0x1f & 1) != 0) ||
              (uVar101 >> 0x27 & 1) != 0) || (uVar101 >> 0x2f & 1) != 0) ||
            (uVar101 >> 0x37 & 1) != 0) || (long)uVar101 < 0) {
          *(uint *)&profile_local->field_0xc = *(uint *)&profile_local->field_0xc | 0x40;
          local_111a = 0;
          local_111c = 0;
          local_111e = 0;
          local_1120 = 0;
          local_1010 = 0;
          matrix._4_4_ = 0;
        }
        *(int *)&profile_local->s1 = (int)local_111a;
        *(int *)((long)&profile_local->s1 + 4) = local_1010;
        profile_local->s1Len = matrix._4_4_;
        *(int *)((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&profile_local->matrix)->extra =
             (int)local_111c;
        ((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&profile_local->matrix)->stats->similar =
             (int)local_111e;
        ((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&profile_local->matrix)->stats->length =
             (int)local_1120;
        parasail_free(ptr_06);
        parasail_free(ptr_05);
        parasail_free(ptr_04);
        parasail_free(ptr_03);
        parasail_free(ptr_02);
        parasail_free(ptr_01);
        parasail_free(ptr_00);
        parasail_free(b_05);
        parasail_free(b_04);
        parasail_free(b_03);
        parasail_free(ptr);
        parasail_free(b_02);
        parasail_free(b_01);
        parasail_free(b_00);
        parasail_free(b);
      }
    }
  }
  return (parasail_result_t *)profile_local;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict pvP = NULL;
    __m128i* restrict pvPm = NULL;
    __m128i* restrict pvPs = NULL;
    __m128i* restrict pvE = NULL;
    __m128i* restrict pvEM = NULL;
    __m128i* restrict pvES = NULL;
    __m128i* restrict pvEL = NULL;
    __m128i* restrict pvH = NULL;
    __m128i* restrict pvHM = NULL;
    __m128i* restrict pvHS = NULL;
    __m128i* restrict pvHL = NULL;
    __m128i* restrict pvHMax = NULL;
    __m128i* restrict pvHMMax = NULL;
    __m128i* restrict pvHSMax = NULL;
    __m128i* restrict pvHLMax = NULL;
    __m128i* restrict pvGapper = NULL;
    __m128i* restrict pvGapperL = NULL;
    int16_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    __m128i vZero;
    __m128i vOne;
    int16_t score = 0;
    int16_t matches = 0;
    int16_t similar = 0;
    int16_t length = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInfFront;
    __m128i vSegLenXgap;
    __m128i vSegLen;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile16.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 8; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP  = (__m128i*)profile->profile16.score;
    pvPm = (__m128i*)profile->profile16.matches;
    pvPs = (__m128i*)profile->profile16.similar;
    vGapO = _mm_set1_epi16(open);
    vGapE = _mm_set1_epi16(gap);
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    vOne = _mm_set1_epi16(1);
    score = NEG_LIMIT;
    matches = 0;
    similar = 0;
    length = 0;
    vNegLimit = _mm_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInfFront = vZero;
    vSegLen = _mm_slli_si128(_mm_set1_epi16(segLen), 2);
    vNegInfFront = _mm_insert_epi16(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm_adds_epi16(vNegInfFront,
            _mm_slli_si128(_mm_set1_epi16(-segLen*gap), 2));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE  = parasail_memalign___m128i(16, segLen);
    pvEM = parasail_memalign___m128i(16, segLen);
    pvES = parasail_memalign___m128i(16, segLen);
    pvEL = parasail_memalign___m128i(16, segLen);
    pvH  = parasail_memalign___m128i(16, segLen);
    pvHM = parasail_memalign___m128i(16, segLen);
    pvHS = parasail_memalign___m128i(16, segLen);
    pvHL = parasail_memalign___m128i(16, segLen);
    pvHMax  = parasail_memalign___m128i(16, segLen);
    pvHMMax = parasail_memalign___m128i(16, segLen);
    pvHSMax = parasail_memalign___m128i(16, segLen);
    pvHLMax = parasail_memalign___m128i(16, segLen);
    pvGapper = parasail_memalign___m128i(16, segLen);
    pvGapperL = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int16_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!pvH) return NULL;
    if (!pvHM) return NULL;
    if (!pvHS) return NULL;
    if (!pvHL) return NULL;
    if (!pvHMax) return NULL;
    if (!pvHMMax) return NULL;
    if (!pvHSMax) return NULL;
    if (!pvHLMax) return NULL;
    if (!pvGapper) return NULL;
    if (!pvGapperL) return NULL;
    if (!boundary) return NULL;

    parasail_memset___m128i(pvHM, vZero, segLen);
    parasail_memset___m128i(pvHS, vZero, segLen);
    parasail_memset___m128i(pvHL, vZero, segLen);
    parasail_memset___m128i(pvE, vNegLimit, segLen);
    parasail_memset___m128i(pvEM, vZero, segLen);
    parasail_memset___m128i(pvES, vZero, segLen);
    parasail_memset___m128i(pvEL, vZero, segLen);
    {
        __m128i vGapper = _mm_subs_epi16(vZero,vGapO);
        __m128i vGapperL = vOne;
        for (i=segLen-1; i>=0; --i) {
            _mm_store_si128(pvGapper+i, vGapper);
            _mm_store_si128(pvGapperL+i, vGapperL);
            vGapper = _mm_subs_epi16(vGapper, vGapE);
            vGapperL = _mm_adds_epi16(vGapperL, vOne);
        }
    }

    /* initialize H */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_16_t h;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
            }
            _mm_store_si128(&pvH[index], h.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT16_MIN ? INT16_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vE_ext;
        __m128i vE_opn;
        __m128i vEM;
        __m128i vES;
        __m128i vEL;
        __m128i vHt;
        __m128i vHtM;
        __m128i vHtS;
        __m128i vHtL;
        __m128i vF;
        __m128i vF_ext;
        __m128i vF_opn;
        __m128i vFM;
        __m128i vFS;
        __m128i vFL;
        __m128i vH;
        __m128i vHM;
        __m128i vHS;
        __m128i vHL;
        __m128i vHp;
        __m128i vHpM;
        __m128i vHpS;
        __m128i vHpL;
        __m128i *pvW;
        __m128i vW;
        __m128i *pvWM;
        __m128i vWM;
        __m128i *pvWS;
        __m128i vWS;
        __m128i case1;
        __m128i case2;
        __m128i vGapper;
        __m128i vGapperL;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm_load_si128(pvH+(segLen-1));
        vHpM = _mm_load_si128(pvHM+(segLen-1));
        vHpS = _mm_load_si128(pvHS+(segLen-1));
        vHpL = _mm_load_si128(pvHL+(segLen-1));
        vHp = _mm_slli_si128(vHp, 2);
        vHpM = _mm_slli_si128(vHpM, 2);
        vHpS = _mm_slli_si128(vHpS, 2);
        vHpL = _mm_slli_si128(vHpL, 2);
        vHp = _mm_insert_epi16(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWM= pvPm+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWS= pvPs+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm_subs_epi16(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        vFM = vZero;
        vFS = vZero;
        vFL = vZero;
        for (i=0; i<segLen; ++i) {
            vH = _mm_load_si128(pvH+i);
            vHM= _mm_load_si128(pvHM+i);
            vHS= _mm_load_si128(pvHS+i);
            vHL= _mm_load_si128(pvHL+i);
            vE = _mm_load_si128(pvE+i);
            vEM= _mm_load_si128(pvEM+i);
            vES= _mm_load_si128(pvES+i);
            vEL= _mm_load_si128(pvEL+i);
            vW = _mm_load_si128(pvW+i);
            vWM = _mm_load_si128(pvWM+i);
            vWS = _mm_load_si128(pvWS+i);
            vGapper = _mm_load_si128(pvGapper+i);
            vGapperL = _mm_load_si128(pvGapperL+i);
            vE_opn = _mm_subs_epi16(vH, vGapO);
            vE_ext = _mm_subs_epi16(vE, vGapE);
            case1 = _mm_cmpgt_epi16(vE_opn, vE_ext);
            vE = _mm_max_epi16(vE_opn, vE_ext);
            vEM = _mm_blendv_epi8(vEM, vHM, case1);
            vES = _mm_blendv_epi8(vES, vHS, case1);
            vEL = _mm_blendv_epi8(vEL, vHL, case1);
            vEL = _mm_adds_epi16(vEL, vOne);
            vGapper = _mm_adds_epi16(vHt, vGapper);
            case1 = _mm_or_si128(
                    _mm_cmpgt_epi16(vF, vGapper),
                    _mm_cmpeq_epi16(vF, vGapper));
            vF = _mm_max_epi16(vF, vGapper);
            vFM = _mm_blendv_epi8(vHtM, vFM, case1);
            vFS = _mm_blendv_epi8(vHtS, vFS, case1);
            vFL = _mm_blendv_epi8(
                    _mm_adds_epi16(vHtL, vGapperL),
                    vFL, case1);
            vHp = _mm_adds_epi16(vHp, vW);
            vHpM = _mm_adds_epi16(vHpM, vWM);
            vHpS = _mm_adds_epi16(vHpS, vWS);
            vHpL = _mm_adds_epi16(vHpL, vOne);
            case1 = _mm_cmpgt_epi16(vE, vHp);
            vHt = _mm_max_epi16(vE, vHp);
            vHtM = _mm_blendv_epi8(vHpM, vEM, case1);
            vHtS = _mm_blendv_epi8(vHpS, vES, case1);
            vHtL = _mm_blendv_epi8(vHpL, vEL, case1);
            _mm_store_si128(pvE+i, vE);
            _mm_store_si128(pvEM+i, vEM);
            _mm_store_si128(pvES+i, vES);
            _mm_store_si128(pvEL+i, vEL);
            _mm_store_si128(pvH+i, vHp);
            _mm_store_si128(pvHM+i, vHpM);
            _mm_store_si128(pvHS+i, vHpS);
            _mm_store_si128(pvHL+i, vHpL);
            vHp = vH;
            vHpM = vHM;
            vHpS = vHS;
            vHpL = vHL;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm_slli_si128(vHt, 2);
        vHtM = _mm_slli_si128(vHtM, 2);
        vHtS = _mm_slli_si128(vHtS, 2);
        vHtL = _mm_slli_si128(vHtL, 2);
        vHt = _mm_insert_epi16(vHt, boundary[j+1], 0);
        vGapper = _mm_load_si128(pvGapper);
        vGapperL = _mm_load_si128(pvGapperL);
        vGapper = _mm_adds_epi16(vHt, vGapper);
        case1 = _mm_or_si128(
                _mm_cmpgt_epi16(vGapper, vF),
                _mm_cmpeq_epi16(vGapper, vF));
        vF = _mm_max_epi16(vF, vGapper);
        vFM = _mm_blendv_epi8(vFM, vHtM, case1);
        vFS = _mm_blendv_epi8(vFS, vHtS, case1);
        vFL = _mm_blendv_epi8(
                vFL,
                _mm_adds_epi16(vHtL, vGapperL),
                case1);
        for (i=0; i<segWidth-2; ++i) {
            __m128i vFt = _mm_slli_si128(vF, 2);
            __m128i vFtM = _mm_slli_si128(vFM, 2);
            __m128i vFtS = _mm_slli_si128(vFS, 2);
            __m128i vFtL = _mm_slli_si128(vFL, 2);
            vFt = _mm_adds_epi16(vFt, vSegLenXgap);
            case1 = _mm_or_si128(
                    _mm_cmpgt_epi16(vFt, vF),
                    _mm_cmpeq_epi16(vFt, vF));
            vF = _mm_max_epi16(vF, vFt);
            vFM = _mm_blendv_epi8(vFM, vFtM, case1);
            vFS = _mm_blendv_epi8(vFS, vFtS, case1);
            vFL = _mm_blendv_epi8(
                    vFL,
                    _mm_adds_epi16(vFtL, vSegLen),
                    case1);
        }

        /* calculate final H */
        vF = _mm_slli_si128(vF, 2);
        vFM = _mm_slli_si128(vFM, 2);
        vFS = _mm_slli_si128(vFS, 2);
        vFL = _mm_slli_si128(vFL, 2);
        vF = _mm_adds_epi16(vF, vNegInfFront);
        case1 = _mm_cmpgt_epi16(vF, vHt);
        vH = _mm_max_epi16(vF, vHt);
        vHM = _mm_blendv_epi8(vHtM, vFM, case1);
        vHS = _mm_blendv_epi8(vHtS, vFS, case1);
        vHL = _mm_blendv_epi8(vHtL, vFL, case1);
        for (i=0; i<segLen; ++i) {
            vHp = _mm_load_si128(pvH+i);
            vHpM = _mm_load_si128(pvHM+i);
            vHpS = _mm_load_si128(pvHS+i);
            vHpL = _mm_load_si128(pvHL+i);
            vE = _mm_load_si128(pvE+i);
            vEM = _mm_load_si128(pvEM+i);
            vES = _mm_load_si128(pvES+i);
            vEL = _mm_load_si128(pvEL+i);
            vF_opn = _mm_subs_epi16(vH, vGapO);
            vF_ext = _mm_subs_epi16(vF, vGapE);
            vF = _mm_max_epi16(vF_opn, vF_ext);
            case1 = _mm_cmpgt_epi16(vF_opn, vF_ext);
            vFM = _mm_blendv_epi8(vFM, vHM, case1);
            vFS = _mm_blendv_epi8(vFS, vHS, case1);
            vFL = _mm_blendv_epi8(vFL, vHL, case1);
            vFL = _mm_adds_epi16(vFL, vOne);
            vH = _mm_max_epi16(vHp, vE);
            vH = _mm_max_epi16(vH, vF);
            case1 = _mm_cmpeq_epi16(vH, vHp);
            case2 = _mm_cmpeq_epi16(vH, vF);
            vHM = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEM, vFM, case2),
                    vHpM, case1);
            vHS = _mm_blendv_epi8(
                    _mm_blendv_epi8(vES, vFS, case2),
                    vHpS, case1);
            vHL = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEL, vFL, case2),
                    vHpL, case1);
            _mm_store_si128(pvH+i, vH);
            _mm_store_si128(pvHM+i, vHM);
            _mm_store_si128(pvHS+i, vHS);
            _mm_store_si128(pvHL+i, vHL);
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vH);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
#endif
        } 

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm_load_si128(pvH + offset);
            vHM = _mm_load_si128(pvHM + offset);
            vHS = _mm_load_si128(pvHS + offset);
            vHL = _mm_load_si128(pvHL + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 2);
                vHM = _mm_slli_si128(vHM, 2);
                vHS = _mm_slli_si128(vHS, 2);
                vHL = _mm_slli_si128(vHL, 2);
            }
            result->stats->rowcols->score_row[j] = (int16_t) _mm_extract_epi16 (vH, 7);
            result->stats->rowcols->matches_row[j] = (int16_t) _mm_extract_epi16 (vHM, 7);
            result->stats->rowcols->similar_row[j] = (int16_t) _mm_extract_epi16 (vHS, 7);
            result->stats->rowcols->length_row[j] = (int16_t) _mm_extract_epi16 (vHL, 7);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvH+i);
        __m128i vHM = _mm_load_si128(pvHM+i);
        __m128i vHS = _mm_load_si128(pvHS+i);
        __m128i vHL = _mm_load_si128(pvHL+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m128i vH = _mm_load_si128(pvH + offset);
        __m128i vHM = _mm_load_si128(pvHM + offset);
        __m128i vHS = _mm_load_si128(pvHS + offset);
        __m128i vHL = _mm_load_si128(pvHL + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128(vH, 2);
            vHM = _mm_slli_si128(vHM, 2);
            vHS = _mm_slli_si128(vHS, 2);
            vHL = _mm_slli_si128(vHL, 2);
        }
        score = (int16_t) _mm_extract_epi16 (vH, 7);
        matches = (int16_t) _mm_extract_epi16 (vHM, 7);
        similar = (int16_t) _mm_extract_epi16 (vHS, 7);
        length = (int16_t) _mm_extract_epi16 (vHL, 7);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi16(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(boundary);
    parasail_free(pvGapperL);
    parasail_free(pvGapper);
    parasail_free(pvHLMax);
    parasail_free(pvHSMax);
    parasail_free(pvHMMax);
    parasail_free(pvHMax);
    parasail_free(pvHL);
    parasail_free(pvHS);
    parasail_free(pvHM);
    parasail_free(pvH);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);

    return result;
}